

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

int __thiscall libwebm::vttdemux::FrameParser::GetChar(FrameParser *this,char *c)

{
  IMkvReader *pIVar1;
  int iVar2;
  Cluster *pCVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar4;
  
  iVar2 = 1;
  if (this->pos_ < this->pos_end_) {
    uVar4 = 1;
    pCVar3 = mkvparser::BlockEntry::GetCluster(&this->block_group_->super_BlockEntry);
    pIVar1 = pCVar3->m_pSegment->m_pReader;
    iVar2 = (**pIVar1->_vptr_IMkvReader)(pIVar1,this->pos_,1,c,in_R8,in_R9,uVar4);
    if (iVar2 < 0) {
      iVar2 = -1;
    }
    else {
      this->pos_ = this->pos_ + 1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int FrameParser::GetChar(char* c) {
  if (pos_ >= pos_end_)  // end-of-stream
    return 1;  // per the semantics of libwebvtt::Reader::GetChar

  const mkvparser::Cluster* const cluster = block_group_->GetCluster();
  const mkvparser::Segment* const segment = cluster->m_pSegment;
  mkvparser::IMkvReader* const reader = segment->m_pReader;

  unsigned char* const buf = reinterpret_cast<unsigned char*>(c);
  const int result = reader->Read(pos_, 1, buf);

  if (result < 0)  // error
    return -1;

  ++pos_;  // consume this character in the stream
  return 0;
}